

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void google::protobuf::SetField
               (uint64 val,FieldDescriptor *field,Message *msg,Reflection *reflection)

{
  LogMessage *pLVar1;
  float value;
  FieldDescriptor *local_68;
  FieldDescriptor *local_60;
  LogMessage local_58;
  
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_58._0_8_ = FieldDescriptor::TypeOnceInit;
    local_68 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_58,&local_68)
    ;
  }
  value = (float)val;
  switch(*(undefined4 *)(field + 0x38)) {
  case 1:
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddDouble(reflection,msg,field,(double)val);
    }
    else {
      Reflection::SetDouble(reflection,msg,field,(double)val);
    }
    break;
  case 2:
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddFloat(reflection,msg,field,value);
    }
    else {
      Reflection::SetFloat(reflection,msg,field,value);
    }
    break;
  case 4:
  case 6:
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddUInt64(reflection,msg,field,val);
    }
    else {
      Reflection::SetUInt64(reflection,msg,field,val);
    }
    break;
  case 7:
  case 0xd:
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddUInt32(reflection,msg,field,(uint32)value);
    }
    else {
      Reflection::SetUInt32(reflection,msg,field,(uint32)value);
    }
    break;
  case 8:
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddBool(reflection,msg,field,val != 0);
    }
    else {
      Reflection::SetBool(reflection,msg,field,val != 0);
    }
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/message.cc"
               ,0xe4);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_58,"Error in descriptors, primitve field with field type ");
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_68 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
      local_60 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_68,
                 &local_60);
    }
    pLVar1 = internal::LogMessage::operator<<(pLVar1,*(int *)(field + 0x38));
    internal::LogFinisher::operator=((LogFinisher *)&local_68,pLVar1);
    internal::LogMessage::~LogMessage(&local_58);
    break;
  case 0xe:
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddEnumValue(reflection,msg,field,(int)value);
    }
    else {
      Reflection::SetEnumValue(reflection,msg,field,(int)value);
    }
    break;
  case 0x11:
    val = (uint64)(-((uint)value & 1) ^ (uint)(val >> 1) & 0x7fffffff);
  case 5:
  case 0xf:
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddInt32(reflection,msg,field,(int32)val);
    }
    else {
      Reflection::SetInt32(reflection,msg,field,(int32)val);
    }
    break;
  case 0x12:
    val = -(ulong)((uint)value & 1) ^ val >> 1;
  case 3:
  case 0x10:
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddInt64(reflection,msg,field,val);
    }
    else {
      Reflection::SetInt64(reflection,msg,field,val);
    }
  }
  return;
}

Assistant:

void SetField(uint64 val, const FieldDescriptor* field, Message* msg,
              const Reflection* reflection) {
#define STORE_TYPE(CPPTYPE_METHOD)                        \
  do                                                      \
    if (field->is_repeated()) {                           \
      reflection->Add##CPPTYPE_METHOD(msg, field, value); \
    } else {                                              \
      reflection->Set##CPPTYPE_METHOD(msg, field, value); \
    }                                                     \
  while (0)

  switch (field->type()) {
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD) \
  case FieldDescriptor::TYPE_##TYPE: {             \
    CPPTYPE value = val;                           \
    STORE_TYPE(CPPTYPE_METHOD);                    \
    break;                                         \
  }

    // Varints
    HANDLE_TYPE(INT32, int32, Int32)
    HANDLE_TYPE(INT64, int64, Int64)
    HANDLE_TYPE(UINT32, uint32, UInt32)
    HANDLE_TYPE(UINT64, uint64, UInt64)
    case FieldDescriptor::TYPE_SINT32: {
      int32 value = WireFormatLite::ZigZagDecode32(val);
      STORE_TYPE(Int32);
      break;
    }
    case FieldDescriptor::TYPE_SINT64: {
      int64 value = WireFormatLite::ZigZagDecode64(val);
      STORE_TYPE(Int64);
      break;
    }
      HANDLE_TYPE(BOOL, bool, Bool)

      // Fixed
      HANDLE_TYPE(FIXED32, uint32, UInt32)
      HANDLE_TYPE(FIXED64, uint64, UInt64)
      HANDLE_TYPE(SFIXED32, int32, Int32)
      HANDLE_TYPE(SFIXED64, int64, Int64)

    case FieldDescriptor::TYPE_FLOAT: {
      float value;
      uint32 bit_rep = val;
      std::memcpy(&value, &bit_rep, sizeof(value));
      STORE_TYPE(Float);
      break;
    }
    case FieldDescriptor::TYPE_DOUBLE: {
      double value;
      uint64 bit_rep = val;
      std::memcpy(&value, &bit_rep, sizeof(value));
      STORE_TYPE(Double);
      break;
    }
    case FieldDescriptor::TYPE_ENUM: {
      int value = val;
      if (field->is_repeated()) {
        reflection->AddEnumValue(msg, field, value);
      } else {
        reflection->SetEnumValue(msg, field, value);
      }
      break;
    }
    default:
      GOOGLE_LOG(FATAL) << "Error in descriptors, primitve field with field type "
                 << field->type();
  }
#undef STORE_TYPE
#undef HANDLE_TYPE
}